

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(WordTagger *this,WordTagger *from)

{
  void *pvVar1;
  string *psVar2;
  string *psVar3;
  LogMessage *other;
  StringVector *pSVar4;
  StringVector *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/WordTagger.pb.cc"
               ,0x20a);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  psVar2 = (from->language_).ptr_;
  if ((psVar2->_M_string_length != 0) && (psVar3 = (this->language_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->language_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->tokensoutputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->tokensoutputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->tokensoutputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->tokentagsoutputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->tokentagsoutputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->tokentagsoutputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->tokenlocationsoutputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->tokenlocationsoutputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->tokenlocationsoutputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->tokenlengthsoutputfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->tokenlengthsoutputfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->tokenlengthsoutputfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->modelparameterdata_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->modelparameterdata_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->modelparameterdata_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  if (from->revision_ != 0) {
    this->revision_ = from->revision_;
  }
  if (from->_oneof_case_[0] == 200) {
    if (this->_oneof_case_[0] != 200) {
      this->_oneof_case_[0] = 200;
      pSVar4 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(pSVar4);
      (this->Tags_).stringtags_ = pSVar4;
    }
    pSVar4 = (this->Tags_).stringtags_;
    if (from->_oneof_case_[0] == 200) {
      from_00 = (from->Tags_).stringtags_;
    }
    else {
      from_00 = StringVector::default_instance();
    }
    StringVector::MergeFrom(pSVar4,from_00);
  }
  return;
}

Assistant:

void WordTagger::MergeFrom(const WordTagger& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CoreMLModels.WordTagger)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.language().size() > 0) {

    language_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.language_);
  }
  if (from.tokensoutputfeaturename().size() > 0) {

    tokensoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokensoutputfeaturename_);
  }
  if (from.tokentagsoutputfeaturename().size() > 0) {

    tokentagsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokentagsoutputfeaturename_);
  }
  if (from.tokenlocationsoutputfeaturename().size() > 0) {

    tokenlocationsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlocationsoutputfeaturename_);
  }
  if (from.tokenlengthsoutputfeaturename().size() > 0) {

    tokenlengthsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlengthsoutputfeaturename_);
  }
  if (from.modelparameterdata().size() > 0) {

    modelparameterdata_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.modelparameterdata_);
  }
  if (from.revision() != 0) {
    set_revision(from.revision());
  }
  switch (from.Tags_case()) {
    case kStringTags: {
      mutable_stringtags()->::CoreML::Specification::StringVector::MergeFrom(from.stringtags());
      break;
    }
    case TAGS_NOT_SET: {
      break;
    }
  }
}